

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  int iVar1;
  uint uVar2;
  xmlStreamCompPtr pxVar3;
  int *piVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  xmlStreamStepPtr pxVar11;
  uint uVar12;
  xmlStreamCtxtPtr comp;
  uint uVar13;
  int iVar14;
  bool bVar15;
  uint local_60;
  
  if ((stream == (xmlStreamCtxtPtr)0x0) || (stream->nbState < 0)) {
    return -1;
  }
  local_60 = 0;
  uVar13 = 0;
  comp = stream;
LAB_0016a0f0:
  do {
    while( true ) {
      if (stream == (xmlStreamCtxtPtr)0x0) {
        return uVar13;
      }
      pxVar3 = stream->comp;
      if (ns != (xmlChar *)0x0 || (name != (xmlChar *)0x0 || nodeType != 1)) break;
      comp->nbState = 0;
      comp->level = 0;
      comp->blockLevel = -1;
      uVar12 = uVar13;
      if ((pxVar3->flags & 0x8000) != 0) {
        uVar12 = 1;
        if (pxVar3->nbStep != 0) {
          if (pxVar3->nbStep == 1) {
            pxVar11 = pxVar3->steps;
            if ((pxVar11->nodeType == 100) && ((pxVar11->flags & 1) != 0)) goto LAB_0016a4a3;
          }
          else {
            pxVar11 = pxVar3->steps;
          }
          uVar12 = uVar13;
          if (((pxVar11->flags & 4) != 0) && (iVar10 = xmlStreamCtxtAddState(comp,0,0), iVar10 < 0))
          {
            return -1;
          }
        }
      }
LAB_0016a4a3:
      stream = comp->next;
      uVar13 = uVar12;
      comp = stream;
    }
    if (pxVar3->nbStep != 0) {
      if ((stream->blockLevel != -1) ||
         ((nodeType - 3U < 0xfffffffe && ((pxVar3->flags & 0x4000) == 0)))) goto LAB_0016a438;
      iVar10 = stream->nbState;
      for (iVar14 = 0; iVar14 < iVar10; iVar14 = iVar14 + 1) {
        piVar4 = stream->states;
        if (((uint)pxVar3->flags >> 0x10 & 1) == 0) {
          iVar8 = stream->level;
          if (piVar4[stream->nbState * 2 + -1] < iVar8) {
            return -1;
          }
          iVar9 = piVar4[stream->nbState * 2 + -2];
          pxVar11 = pxVar3->steps;
          iVar14 = iVar10;
LAB_0016a1df:
          uVar12 = pxVar11[iVar9].flags;
          iVar1 = pxVar11[iVar9].nodeType;
          if (iVar1 == nodeType) {
            if (nodeType == 100) {
LAB_0016a354:
              local_60 = uVar12 & 2;
              if (local_60 == 0) {
                iVar9 = xmlStreamCtxtAddState(stream,iVar9 + 1,stream->level + 1);
                if (iVar9 < 0) {
                  return -1;
                }
                bVar7 = 0;
                local_60 = 0;
                bVar15 = uVar13 != 1;
                uVar13 = 1;
                if (bVar15) {
                  uVar13 = uVar12 >> 5 & 1;
                  bVar7 = 0;
                  local_60 = 0;
                }
              }
              else {
                bVar7 = 0;
                uVar13 = 1;
              }
            }
            else {
              pxVar5 = pxVar11[iVar9].name;
              pxVar6 = pxVar11[iVar9].ns;
              if (pxVar5 == (xmlChar *)0x0) {
                if (pxVar6 != (xmlChar *)0x0) {
                  if (ns == (xmlChar *)0x0) goto LAB_0016a3d2;
                  iVar8 = xmlStrEqual(pxVar6,ns);
LAB_0016a349:
                  if (iVar8 == 0) {
LAB_0016a3e8:
                    bVar7 = 1;
                    goto LAB_0016a3f3;
                  }
                }
                goto LAB_0016a354;
              }
              bVar7 = 1;
              if (name == (xmlChar *)0x0) {
LAB_0016a3d2:
                bVar7 = 1;
              }
              else if (((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0)) && (*pxVar5 == *name))
              {
                iVar8 = xmlStrEqual(pxVar5,name);
                if (iVar8 == 0) goto LAB_0016a3e8;
                if (pxVar6 != ns) {
                  iVar8 = xmlStrEqual(pxVar6,ns);
                  goto LAB_0016a349;
                }
                goto LAB_0016a354;
              }
            }
LAB_0016a3f3:
            if ((pxVar3->flags & 0x10000) == 0) {
              if ((bool)(bVar7 | local_60 != 0)) {
                iVar8 = stream->level;
                goto LAB_0016a40c;
              }
              local_60 = 0;
            }
          }
          else {
            if (iVar1 == 100) goto LAB_0016a354;
            if ((iVar1 != 2) || (((uint)pxVar3->flags >> 0x10 & 1) != 0)) goto LAB_0016a41c;
LAB_0016a40c:
            stream->blockLevel = iVar8 + 1;
          }
        }
        else {
          iVar9 = piVar4[(uint)(iVar14 * 2)];
          if (-1 < (long)iVar9) {
            iVar8 = stream->level;
            if ((piVar4[(ulong)(uint)(iVar14 * 2) + 1] <= iVar8) &&
               ((pxVar11 = pxVar3->steps, iVar8 <= piVar4[(ulong)(uint)(iVar14 * 2) + 1] ||
                ((pxVar11[iVar9].flags & 1U) != 0)))) goto LAB_0016a1df;
          }
        }
LAB_0016a41c:
      }
      iVar10 = stream->level;
      iVar14 = iVar10 + 1;
      stream->level = iVar14;
      pxVar11 = pxVar3->steps;
      uVar12 = pxVar11->flags;
      if ((uVar12 & 4) != 0) goto LAB_0016a43c;
      pxVar5 = pxVar11->name;
      pxVar6 = pxVar11->ns;
      uVar2 = stream->flags;
      if ((uVar2 & 7) == 0) {
LAB_0016a4e9:
        if (pxVar11->nodeType == nodeType) {
          if (nodeType == 100) {
LAB_0016a58d:
            local_60 = uVar12 & 2;
            if (local_60 == 0) {
              iVar10 = xmlStreamCtxtAddState(stream,1,stream->level);
              if (iVar10 < 0) {
                return -1;
              }
              local_60 = 0;
              bVar7 = 0;
              bVar15 = uVar13 != 1;
              uVar13 = 1;
              if (bVar15) {
                uVar13 = uVar12 >> 5 & 1;
                local_60 = 0;
                bVar7 = 0;
              }
            }
            else {
              bVar7 = 0;
              uVar13 = 1;
            }
          }
          else {
            if (pxVar5 == (xmlChar *)0x0) {
              if ((pxVar6 != (xmlChar *)0x0) &&
                 ((ns == (xmlChar *)0x0 || (iVar10 = xmlStrEqual(pxVar6,ns), iVar10 == 0))))
              goto LAB_0016a651;
              goto LAB_0016a58d;
            }
            if ((name != (xmlChar *)0x0) &&
               (((((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0) && (*pxVar5 == *name)) &&
                 (iVar10 = xmlStrEqual(pxVar5,name), iVar10 != 0)) &&
                ((pxVar6 == ns || (iVar10 = xmlStrEqual(pxVar6,ns), iVar10 != 0))))))
            goto LAB_0016a58d;
LAB_0016a651:
            local_60 = uVar12 & 2;
            bVar7 = 1;
          }
          if ((pxVar3->flags & 0x10000) == 0) {
            if ((bool)(~bVar7 & local_60 == 0)) {
              local_60 = 0;
            }
            else {
              stream->blockLevel = stream->level;
            }
          }
        }
        else if ((nodeType != 2) && (pxVar11->nodeType == 100)) goto LAB_0016a58d;
      }
      else if (iVar10 == 0) {
        if ((uVar2 & 6) == 0) goto LAB_0016a4e9;
      }
      else if (((uVar12 & 1) != 0) || ((uVar2 & 6) != 0 && iVar14 == 2)) goto LAB_0016a4e9;
LAB_0016a43c:
      stream = stream->next;
      comp = stream;
      goto LAB_0016a0f0;
    }
    if ((stream->flags & 1U) == 0) {
      if ((nodeType != 2) && (((stream->flags & 6U) == 0 || (stream->level == 0)))) {
        uVar13 = 1;
      }
LAB_0016a438:
      stream->level = stream->level + 1;
      goto LAB_0016a43c;
    }
    stream = stream->next;
  } while( true );
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			if (xmlStreamCtxtAddState(stream, 0, 0) < 0)
                            return(-1);
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
                if (final) {
                    ret = 1;
                } else if (xmlStreamCtxtAddState(stream, stepNr + 1,
                                                 stream->level + 1) < 0) {
                    return(-1);
                }
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final) {
		ret = 1;
            } else if (xmlStreamCtxtAddState(stream, 1, stream->level) < 0) {
                return(-1);
            }
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    return(ret);
}